

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int nsize;
  long lVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b;
  string str;
  datanode node [60];
  allocator local_1959;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1958;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f8;
  string local_18d8;
  string local_18b8;
  string local_1898;
  datanode local_1878 [60];
  
  local_1938.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1938.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1938.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1898,argv[1],(allocator *)local_1878);
  readvector(&local_1938,&local_1898);
  std::__cxx11::string::~string((string *)&local_1898);
  lVar1 = 0;
  do {
    datanode::datanode((datanode *)((long)&local_1878[0].name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0x1860);
  std::__cxx11::string::string((string *)&local_1918,"",(allocator *)&local_18f8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1938,
             &local_1918);
  std::__cxx11::string::~string((string *)&local_1918);
  std::__cxx11::string::string((string *)&local_1918,"module ",(allocator *)&local_18f8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1958,
             &local_1918);
  std::__cxx11::string::~string((string *)&local_1918);
  std::__cxx11::string::string((string *)&local_18b8,argv[1],(allocator *)&local_18f8);
  remove_txt(&local_1918,&local_18b8);
  std::__cxx11::string::~string((string *)&local_18b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1958,&local_1918);
  nsize = findallnodes(&local_1938,local_1878);
  printnode(&local_1958,local_1878,nsize);
  datapathgenerator(&local_1938,local_1878);
  findfunction(&local_1938,&local_1958,local_1878);
  std::__cxx11::string::string((string *)&local_18f8,"endmodule",&local_1959);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1958,
             &local_18f8);
  std::__cxx11::string::~string((string *)&local_18f8);
  std::__cxx11::string::string((string *)&local_18d8,argv[2],(allocator *)&local_18f8);
  writevector(&local_1958,&local_18d8);
  std::__cxx11::string::~string((string *)&local_18d8);
  std::__cxx11::string::~string((string *)&local_1918);
  lVar1 = 0x17f8;
  do {
    datanode::~datanode((datanode *)((long)&local_1878[0].name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x68;
  } while (lVar1 != -0x68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1958);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1938);
  return 0;
}

Assistant:

int main(int argc, char*argv[]) {
	vector<string> b;			//read vector
	vector<string> c;			//write vector
	readvector(b,argv[1]);	
	
	datanode node[60];
	b.push_back("\0");
	c.push_back("module ");
	string str = remove_txt(argv[1]);	//find the name of module
	c.push_back(str);
	int nsize=findallnodes(b,node);
	printnode(c, node, nsize);		//print the node..can be removed
	datapathgenerator(b, node);		//to generate data path  critical value
	findfunction(b, c, node); 		// finds the add,sub... functions and converts them to module in verilog
	
	c.push_back("endmodule");
	writevector(c, argv[2]);
	//print(c);
	return 0;
}